

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3ExprIsConstantNotJoin(Expr *p)

{
  Walker w;
  Walker local_30;
  
  local_30.eCode = 2;
  local_30.xExprCallback = exprNodeIsConstant;
  local_30.xSelectCallback = sqlite3SelectWalkFail;
  local_30.u.n = 0;
  if (p != (Expr *)0x0) {
    walkExpr(&local_30,p);
  }
  return (int)local_30.eCode;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprIsConstantNotJoin(Expr *p){
  return exprIsConst(p, 2, 0);
}